

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compress.cpp
# Opt level: O3

void duckdb::roaring::RoaringCompressState::HandleByte
               (RoaringCompressState *state,uint8_t array_index)

{
  uint16_t *puVar1;
  uint16_t uVar2;
  int iVar3;
  undefined7 in_register_00000031;
  
  iVar3 = (int)CONCAT71(in_register_00000031,array_index);
  if (iVar3 != 0) {
    if (iVar3 == 0xff) {
      HandleAllValid(state,8);
      return;
    }
    HandleRaggedByte(state,array_index,8);
    return;
  }
  uVar2 = (state->container_state).length;
  if (uVar2 != 0) {
    if ((state->container_state).last_bit_set != true) goto LAB_016f2acb;
    (*(state->container_state).append_function)(&state->container_state,false,uVar2);
    (state->container_state).last_is_null = false;
    puVar1 = &(state->container_state).appended_count;
    *puVar1 = *puVar1 + uVar2;
  }
  uVar2 = 0;
LAB_016f2acb:
  (state->container_state).length = uVar2 + 8;
  (state->container_state).last_bit_set = false;
  return;
}

Assistant:

void RoaringCompressState::HandleByte(RoaringCompressState &state, uint8_t array_index) {
	if (array_index == NumericLimits<uint8_t>::Maximum()) {
		HandleAllValid(state, 8);
	} else if (array_index == 0) {
		HandleNoneValid(state, 8);
	} else {
		HandleRaggedByte(state, array_index, 8);
	}
}